

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::FindDeclaredConstant
          (ConstantManager *this,Constant *c,uint32_t type_id)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  pointer ppVar3;
  Instruction *this_02;
  Instruction *const_def;
  pair<std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
  range;
  Constant *pCStack_20;
  uint32_t type_id_local;
  Constant *c_local;
  ConstantManager *this_local;
  
  range.second._M_node._4_4_ = type_id;
  pCStack_20 = c;
  c_local = (Constant *)this;
  pCStack_20 = FindConstant(this,c);
  if (pCStack_20 != (Constant *)0x0) {
    _const_def = std::
                 multimap<const_spvtools::opt::analysis::Constant_*,_unsigned_int,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
                 ::equal_range(&this->const_val_to_id_,&stack0xffffffffffffffe0);
    while (bVar1 = std::operator!=((_Self *)&const_def,&range.first), bVar1) {
      this_00 = context(this);
      this_01 = IRContext::get_def_use_mgr(this_00);
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
                             *)&const_def);
      this_02 = DefUseManager::GetDef(this_01,ppVar3->second);
      if ((range.second._M_node._4_4_ == 0) ||
         (uVar2 = opt::Instruction::type_id(this_02), uVar2 == range.second._M_node._4_4_)) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
                               *)&const_def);
        return ppVar3->second;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
                    *)&const_def);
    }
  }
  return 0;
}

Assistant:

uint32_t ConstantManager::FindDeclaredConstant(const Constant* c,
                                               uint32_t type_id) const {
  c = FindConstant(c);
  if (c == nullptr) {
    return 0;
  }

  for (auto range = const_val_to_id_.equal_range(c);
       range.first != range.second; ++range.first) {
    Instruction* const_def =
        context()->get_def_use_mgr()->GetDef(range.first->second);
    if (type_id == 0 || const_def->type_id() == type_id) {
      return range.first->second;
    }
  }
  return 0;
}